

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O3

int __thiscall
FormatTypeSCP::LoadDisk
          (FormatTypeSCP *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  int iVar6;
  IDisk *this_00;
  MFMTrack *pMVar7;
  ulong uVar8;
  FormatTypeSCP *pFVar9;
  ulong *puVar10;
  uchar *bitfield;
  undefined8 *puVar11;
  void *__s;
  long lVar12;
  byte bVar13;
  int side;
  ulong uVar14;
  FormatTypeSCP *this_01;
  int duration;
  long lVar15;
  Revolution *pRVar16;
  uint uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  duration = (int)loading_progress;
  iVar6 = -1;
  if (buffer[2] == 'P' && *(short *)buffer == 0x4353) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[5];
    bVar2 = buffer[7];
    bVar18 = 0x2a < bVar2;
    uVar17 = CONCAT31(0,bVar2 >> bVar18);
    this_00->nb_sides_ = bVar18 + '\x01';
    uVar14 = (ulong)((uVar17 + 1) * 0x20);
    auVar22._4_4_ = 0;
    auVar22._0_4_ = uVar17;
    auVar22[8] = bVar2 >> bVar18;
    auVar22._9_7_ = 0;
    lVar15 = 0;
    auVar22 = auVar22 | _DAT_001a7900;
    do {
      this_00->side_[lVar15].nb_tracks = uVar17 + 1;
      pMVar7 = (MFMTrack *)operator_new__(uVar14);
      this_00->side_[lVar15].tracks = pMVar7;
      memset(pMVar7,0,uVar14);
      auVar4 = _DAT_001a7900;
      local_78 = auVar22._0_4_;
      iStack_74 = auVar22._4_4_;
      iStack_70 = auVar22._8_4_;
      iStack_6c = auVar22._12_4_;
      uVar8 = 0;
      auVar19 = _DAT_001a78f0;
      auVar20 = _DAT_001a78e0;
      do {
        auVar21 = auVar19 ^ auVar4;
        if ((bool)(~(auVar21._4_4_ == iStack_74 && local_78 < auVar21._0_4_ ||
                    iStack_74 < auVar21._4_4_) & 1)) {
          *(undefined4 *)((long)&pMVar7->nb_revolutions + uVar8) = 1;
        }
        if ((auVar21._12_4_ != iStack_6c || auVar21._8_4_ <= iStack_70) &&
            auVar21._12_4_ <= iStack_6c) {
          *(undefined4 *)((long)&pMVar7[1].nb_revolutions + uVar8) = 1;
        }
        auVar21 = auVar20 ^ auVar4;
        iVar6 = auVar21._4_4_;
        if (iVar6 <= iStack_74 && (iVar6 != iStack_74 || auVar21._0_4_ <= local_78)) {
          *(undefined4 *)((long)&pMVar7[2].nb_revolutions + uVar8) = 1;
          *(undefined4 *)((long)&pMVar7[3].nb_revolutions + uVar8) = 1;
        }
        lVar12 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 4;
        auVar19._8_8_ = lVar12 + 4;
        lVar12 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar12 + 4;
        uVar8 = uVar8 + 0x80;
      } while ((uVar17 * 0x20 + 0x80 & 0xffffff80) != uVar8);
      lVar15 = lVar15 + 1;
    } while (lVar15 != (ulong)bVar18 + 1);
    pFVar9 = (FormatTypeSCP *)((ulong)bVar1 * 0x30 + 8);
    lVar15 = 0;
    do {
      uVar14 = (ulong)*(uint *)(buffer + lVar15 * 4 + 0x10);
      this->tracks_header_[lVar15].offset = *(uint *)(buffer + lVar15 * 4 + 0x10);
      if (uVar14 != 0) {
        if (buffer[uVar14 + 2] != 'K' || *(short *)(buffer + uVar14) != 0x5254) {
          return -3;
        }
        bVar5 = 0x2a < bVar2 & buffer[uVar14 + 3];
        bVar13 = buffer[uVar14 + 3] >> (0x2a < bVar2);
        if (this_00->side_[bVar5].nb_tracks <= (uint)bVar13) {
          return -1;
        }
        pMVar7 = this_00->side_[bVar5].tracks;
        pMVar7[bVar13].nb_revolutions = (uint)bVar1;
        this_01 = pFVar9;
        puVar10 = (ulong *)operator_new__((ulong)pFVar9);
        pRVar16 = (Revolution *)(puVar10 + 1);
        *puVar10 = (ulong)bVar1;
        if (bVar1 == 0) {
          pMVar7[bVar13].revolution = pRVar16;
        }
        else {
          lVar12 = 0;
          do {
            *(undefined1 (*) [16])((long)puVar10 + lVar12 + 0x18) = (undefined1  [16])0x0;
            *(undefined8 *)((long)puVar10 + lVar12 + 0x28) = 0;
            lVar12 = lVar12 + 0x30;
          } while ((ulong)bVar1 * 0x30 != lVar12);
          pMVar7[bVar13].revolution = pRVar16;
          if (bVar1 != 0) {
            lVar12 = 0;
            do {
              iVar6 = *(int *)(buffer + lVar12 + uVar14 + 8);
              iVar3 = *(int *)(buffer + lVar12 + uVar14 + 0xc);
              this->rpm_correction_ =
                   (double)(*(int *)(buffer + lVar12 + uVar14 + 4) / 40000) / 200.0;
              uVar17 = ComputeTrack(this_01,(uchar *)0x0,buffer + (long)iVar3 + uVar14,iVar6,
                                    duration);
              (&pRVar16->size)[lVar12] = uVar17;
              this_01 = (FormatTypeSCP *)(ulong)uVar17;
              bitfield = (uchar *)operator_new__((ulong)this_01);
              *(uchar **)((long)&(pMVar7[bVar13].revolution)->bitfield + lVar12 * 4) = bitfield;
              uVar17 = ComputeTrack(this_01,bitfield,buffer + (long)iVar3 + uVar14,iVar6,duration);
              pRVar16 = pMVar7[bVar13].revolution;
              (&pRVar16->size)[lVar12] = uVar17;
              lVar12 = lVar12 + 0xc;
            } while ((ulong)((uint)bVar1 * 4) * 3 != lVar12);
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xa6);
    lVar15 = 0;
    do {
      uVar17 = this_00->side_[lVar15].nb_tracks;
      lVar12 = 0;
      do {
        if ((ulong)uVar17 << 5 == lVar12) break;
        pMVar7 = this_00->side_[lVar15].tracks;
        if (*(long *)((long)&pMVar7->revolution + lVar12) == 0) {
          *(undefined4 *)((long)&pMVar7->nb_revolutions + lVar12) = 1;
          puVar11 = (undefined8 *)operator_new__(0x38);
          *puVar11 = 1;
          *(undefined1 (*) [16])(puVar11 + 3) = (undefined1  [16])0x0;
          puVar11[5] = 0;
          *(undefined8 **)((long)&pMVar7->revolution + lVar12) = puVar11 + 1;
          __s = operator_new__(100000);
          puVar11 = *(undefined8 **)((long)&pMVar7->revolution + lVar12);
          *puVar11 = __s;
          *(undefined4 *)(puVar11 + 1) = 100000;
          memset(__s,0,100000);
        }
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x560);
      lVar15 = lVar15 + 1;
    } while (lVar15 != (ulong)bVar18 + 1);
    *created_disk = this_00;
    (*this_00->_vptr_IDisk[0x14])();
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int FormatTypeSCP::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   unsigned char version, diskType, numRevolution;
   unsigned char startTrack, endTrack, flags;
   unsigned int check_sum_computed = 0;
   const unsigned char* header = buffer;

   if (memcmp(header, "SCP", 3) == 0)
   {
      IDisk* new_disk = new IDisk();

      version = header[3];
      diskType = header[4];
      numRevolution = header[5];
      startTrack = header[6];
      endTrack = header[7];
      flags = header[8];
      unsigned char width = header[9];
      unsigned char nb_heads = header[0x0A];
      unsigned int checkSum = *((unsigned int*)(&header[0x0C]));

      // Check the checksum !
      for (unsigned int crc = 0x10; crc < size; crc++)
      {
         check_sum_computed += header[crc];
      }
      // Compare :
      if (check_sum_computed != checkSum)
      {
         // Something to do ?
         int dbg = 1;
      }


      // Number of side :
      new_disk->nb_sides_ = (endTrack > 42) ? 2 : 1;
      int nbtracks = ((new_disk->nb_sides_ == 1) ? (endTrack) : (endTrack) / 2) + 1;
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = nbtracks;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[nbtracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * nbtracks);
         for (int tr = 0; tr < nbtracks; tr++)
         {
            new_disk->side_[side].tracks[tr].nb_revolutions = 1;
         }
      }

      // Track data header
      for (int i = 0; i < 166; i++)
      {
         tracks_header_[i].offset = *((unsigned int*)(&header[0x10 + i * 4]));

         if (tracks_header_[i].offset != 0)
         {
            const unsigned char* track_buffer = &header[tracks_header_[i].offset];
            // Check the TRK
            if (memcmp(&track_buffer[0], "TRK", 3) != 0)
            {
               // Error : No valid SCP file
               return -3;
            }

            // Track number
            int side = (new_disk->nb_sides_ == 1) ? 0 : (track_buffer[0x03] & 0x1);
            unsigned int track = (new_disk->nb_sides_ == 1) ? track_buffer[0x03] : (track_buffer[0x03] >> 1);

            if (track >= new_disk->side_[side].nb_tracks)
            {
               // TODO : Do Something here !
               int dbg = 1;
               return -1;
            }

            // Revolutions
            new_disk->side_[side].tracks[track].nb_revolutions = numRevolution;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[numRevolution];

            for (int revolution = 0; revolution < numRevolution; revolution++)
            {
               //
               int duration = *((unsigned int*)(&track_buffer[0x04 + revolution * 12]));
               int length = *((unsigned int*)(&track_buffer[0x08 + revolution * 12]));
               int offset = *((unsigned int*)(&track_buffer[0x0C + revolution * 12]));

               //timeElapsed / ick * 1000;
               rpm_correction_ = (duration * 25 / 1000000) / 200.0;

               // Read the whole bitcells
               const unsigned char* cellbuffer = &track_buffer[offset];

               // Comute size in term of bits
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  NULL, cellbuffer, length, duration);

               // Fill the bitfield
               new_disk->side_[side].tracks[track].revolution[revolution].bitfield = new unsigned char[new_disk->side_[
                  side].tracks[track].revolution[revolution].size];
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  new_disk->side_[side].tracks[track].revolution[revolution].bitfield, cellbuffer, length, duration);
            }

            //AdjustLength ( m_Disk[side].Tracks[track].Revolution, numRevolution);

            if (track == 0)
            {
               //DumpTrack (0, 0, 0);
            }
         }
      }
      // Adjust missing tracks :
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (int track = 0; track < 43 && track < new_disk->side_[side].nb_tracks; track++)
         {
            if (new_disk->side_[side].tracks[track].revolution == NULL)
            {
               // Fill this revolution with random datas
               new_disk->side_[side].tracks[track].nb_revolutions = 1;
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[6250 * 16];
               new_disk->side_[side].tracks[track].revolution[0].size = 6250 * 16;
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, 6250 * 16);
            }
         }
      }
      created_disk = new_disk;
   }
   else
   {
      // Erreur : Not a DSK file !
      return FILE_ERROR;
   }

   created_disk->CreateTrackFromMultiRevolutions();

   return OK;
}